

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O1

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::down_heap(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *this,size_t index)

{
  ulong uVar1;
  pointer phVar2;
  long lVar3;
  pointer phVar4;
  duration dVar5;
  per_timer_data *ppVar6;
  per_timer_data *ppVar7;
  ulong uVar8;
  ulong uVar9;
  
  lVar3 = index * 2;
  while( true ) {
    uVar8 = lVar3 + 1;
    phVar4 = (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)(this->heap_).
                  super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)phVar4 >> 4;
    if (uVar9 <= uVar8) {
      return;
    }
    uVar1 = lVar3 + 2;
    if ((uVar1 != uVar9) && (phVar4[uVar1].time_.__d.__r <= phVar4[uVar8].time_.__d.__r)) {
      uVar8 = uVar1;
    }
    if (phVar4[index].time_.__d.__r < phVar4[uVar8].time_.__d.__r) break;
    phVar2 = phVar4 + index;
    dVar5.__r = (phVar2->time_).__d.__r;
    ppVar6 = phVar2->timer_;
    ppVar7 = phVar4[uVar8].timer_;
    (phVar2->time_).__d.__r = phVar4[uVar8].time_.__d.__r;
    phVar2->timer_ = ppVar7;
    phVar4 = (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar8;
    (phVar4->time_).__d.__r = dVar5.__r;
    phVar4->timer_ = ppVar6;
    phVar4 = (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (phVar4[index].timer_)->heap_index_ = index;
    (phVar4[uVar8].timer_)->heap_index_ = uVar8;
    lVar3 = uVar8 * 2;
    index = uVar8;
  }
  return;
}

Assistant:

void down_heap(std::size_t index)
  {
    std::size_t child = index * 2 + 1;
    while (child < heap_.size())
    {
      std::size_t min_child = (child + 1 == heap_.size()
          || Time_Traits::less_than(
            heap_[child].time_, heap_[child + 1].time_))
        ? child : child + 1;
      if (Time_Traits::less_than(heap_[index].time_, heap_[min_child].time_))
        break;
      swap_heap(index, min_child);
      index = min_child;
      child = index * 2 + 1;
    }
  }